

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.h
# Opt level: O0

void __thiscall
dg::llvmdg::NTSCD::NTSCD(NTSCD *this,Module *module,LLVMControlDependenceAnalysisOptions *opts)

{
  LLVMControlDependenceAnalysisOptions *in_RSI;
  Module *in_RDI;
  CDGraphBuilder *this_00;
  LLVMControlDependenceAnalysisOptions *in_stack_ffffffffffffff70;
  LLVMControlDependenceAnalysisImpl *in_stack_ffffffffffffff80;
  
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions
            (in_stack_ffffffffffffff70,in_RSI);
  LLVMControlDependenceAnalysisImpl::LLVMControlDependenceAnalysisImpl
            (in_stack_ffffffffffffff80,in_RDI,in_stack_ffffffffffffff70);
  LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions
            (in_stack_ffffffffffffff70);
  *(undefined ***)in_RDI = &PTR__NTSCD_0029eae8;
  this_00 = (CDGraphBuilder *)(in_RDI + 0x70);
  memset(this_00,0,0x70);
  CDGraphBuilder::CDGraphBuilder(this_00);
  std::
  unordered_map<const_llvm::Function_*,_dg::llvmdg::NTSCD::Info,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::NTSCD::Info>_>_>
  ::unordered_map((unordered_map<const_llvm::Function_*,_dg::llvmdg::NTSCD::Info,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::NTSCD::Info>_>_>
                   *)0x231bea);
  llvm::Module::size((Module *)0x231c07);
  std::
  unordered_map<const_llvm::Function_*,_dg::llvmdg::NTSCD::Info,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::NTSCD::Info>_>_>
  ::reserve((unordered_map<const_llvm::Function_*,_dg::llvmdg::NTSCD::Info,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::NTSCD::Info>_>_>
             *)this_00,(size_type)in_RSI);
  return;
}

Assistant:

NTSCD(const llvm::Module *module,
          const LLVMControlDependenceAnalysisOptions &opts = {})
            : LLVMControlDependenceAnalysisImpl(module, opts) {
        _graphs.reserve(module->size());
    }